

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void __thiscall
TPZFMatrix<long_double>::Transpose(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *T)

{
  long lVar1;
  long lVar2;
  longdouble *plVar3;
  longdouble *plVar4;
  long lVar5;
  
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol,
             (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow);
  lVar2 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  if (0 < lVar2) {
    lVar1 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
    plVar4 = this->fElem;
    lVar5 = 0;
    do {
      if (0 < lVar1) {
        lVar2 = 0;
        plVar3 = plVar4;
        do {
          plVar4 = plVar3 + 1;
          (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(T,lVar5,lVar2,plVar3);
          lVar2 = lVar2 + 1;
          lVar1 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          plVar3 = plVar4;
        } while (lVar2 < lVar1);
        lVar2 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < lVar2);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::Transpose(TPZMatrix<TVar> *const T) const{
    T->Resize( this->Cols(), this->Rows() );
    //Transposta por filas
    TVar * p = fElem;
    for ( int64_t c = 0; c < this->Cols(); c++ ) {
        for ( int64_t r = 0; r < this->Rows(); r++ ) {
            T->PutVal( c, r, *p++ );
            //            cout<<"(r,c)= "<<r<<"  "<<c<<"\n";
        }
    }
}